

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kats_test.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  picnic_params_t param;
  picnic_params_t_conflict param_00;
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  int iVar4;
  picnic_params_t *ppVar5;
  picnic_params_t *local_48;
  picnic_params_t *local_40;
  
  if (argc == 2) {
    param_00 = argument_to_params(argv[1]);
    if (param_00 == PARAMETER_SET_INVALID) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ERR: invalid test idx",0x15);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
      std::ostream::put(-0x38);
      std::ostream::flush();
      iVar4 = 1;
    }
    else {
      iVar1 = anon_unknown.dwarf_3825::run_test(param_00);
      iVar4 = 0;
      if (iVar1 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"ERR: Picnic KAT test ",0x15);
        pcVar2 = (char *)picnic_get_param_name(param_00);
        if (pcVar2 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1070c8);
        }
        else {
          sVar3 = strlen(pcVar2);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar2,sVar3);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," FAILED",7);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
        std::ostream::put(-0x38);
        std::ostream::flush();
        iVar4 = -1;
      }
    }
  }
  else {
    all_supported_parameters();
    iVar4 = 0;
    ppVar5 = local_48;
    if (local_48 != local_40) {
      do {
        param = *ppVar5;
        iVar1 = anon_unknown.dwarf_3825::run_test(param);
        if (iVar1 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"ERR: Picnic KAT test ",0x15);
          pcVar2 = (char *)picnic_get_param_name(param);
          if (pcVar2 == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1070c8);
          }
          else {
            sVar3 = strlen(pcVar2);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar2,sVar3);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," FAILED",7);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
          std::ostream::put(-0x38);
          iVar4 = -1;
          std::ostream::flush();
        }
        ppVar5 = ppVar5 + 1;
      } while (ppVar5 != local_40);
    }
    if (local_48 != (picnic_params_t *)0x0) {
      operator_delete(local_48);
    }
  }
  return iVar4;
}

Assistant:

int main(int argc, char** argv) {
  if (argc == 2) {
    const picnic_params_t param = argument_to_params(argv[1]);
    if (param == PARAMETER_SET_INVALID) {
      std::cout << "ERR: invalid test idx" << std::endl;
      return 1;
    }

    const int t = run_test(param);
    if (!t) {
      std::cout << "ERR: Picnic KAT test " << picnic_get_param_name(param) << " FAILED"
                << std::endl;
      return -1;
    }
    return 0;
  }

  int ret = 0;
  for (const auto s : all_supported_parameters()) {
    const int t = run_test(s);
    if (!t) {
      std::cout << "ERR: Picnic KAT test " << picnic_get_param_name(s) << " FAILED" << std::endl;
      ret = -1;
    }
  }

  return ret;
}